

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-mpi.c
# Opt level: O0

int big_block_mpi_grow(BigBlock *bb,int Nfile_grow,size_t *fsize_grow,MPI_Comm comm)

{
  int iVar1;
  FILE *__stream;
  FILE *fp;
  int i;
  int oldNfile;
  int rt;
  int NTask;
  int rank;
  MPI_Comm comm_local;
  size_t *fsize_grow_local;
  BigBlock *pBStack_18;
  int Nfile_grow_local;
  BigBlock *bb_local;
  
  if (comm == (MPI_Comm)&ompi_mpi_comm_null) {
    bb_local._4_4_ = 0;
  }
  else {
    _NTask = comm;
    comm_local = (MPI_Comm)fsize_grow;
    fsize_grow_local._4_4_ = Nfile_grow;
    pBStack_18 = bb;
    MPI_Comm_size(comm,&oldNfile);
    MPI_Comm_rank(_NTask,&rt);
    iVar1 = pBStack_18->Nfile;
    if (rt == 0) {
      i = _big_block_grow_internal(pBStack_18,fsize_grow_local._4_4_,(size_t *)comm_local);
    }
    else {
      i = 0;
    }
    bb_local._4_4_ = big_file_mpi_broadcast_anyerror(i,_NTask);
    if (bb_local._4_4_ == 0) {
      if (rt != 0) {
        _big_block_close_internal(pBStack_18);
      }
      big_block_mpi_broadcast(pBStack_18,0,_NTask);
      for (fp._4_4_ = (int)((ulong)((long)fsize_grow_local._4_4_ * (long)rt) / (ulong)(long)oldNfile
                           ); i = 0,
          (ulong)(long)fp._4_4_ <
          (ulong)((long)fsize_grow_local._4_4_ * (long)(rt + 1)) / (ulong)(long)oldNfile;
          fp._4_4_ = fp._4_4_ + 1) {
        __stream = (FILE *)_big_file_open_a_file(pBStack_18->basename,fp._4_4_ + iVar1,"w",1);
        if (__stream == (FILE *)0x0) {
          i = -1;
          break;
        }
        fclose(__stream);
      }
      bb_local._4_4_ = big_file_mpi_broadcast_anyerror(i,_NTask);
    }
  }
  return bb_local._4_4_;
}

Assistant:

int
big_block_mpi_grow(BigBlock * bb,
    int Nfile_grow,
    const size_t fsize_grow[],
    MPI_Comm comm) {

    int rank;
    int NTask;
    int rt;

    if(comm == MPI_COMM_NULL) return 0;

    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &rank);

    int oldNfile = bb->Nfile;

    if(rank == 0) {
        rt = _big_block_grow_internal(bb, Nfile_grow, fsize_grow);
    } else {
        rt = 0;
    }

    BCAST_AND_RAISEIF(rt, comm);

    if(rank != 0) {
        /* closed on non-root because we will bcast.*/
        _big_block_close_internal(bb);
    }
    big_block_mpi_broadcast(bb, 0, comm);

    int i;
    for(i = (size_t) Nfile_grow * rank / NTask; i < (size_t) Nfile_grow * (rank + 1) / NTask; i ++) {
        FILE * fp = _big_file_open_a_file(bb->basename, i + oldNfile, "w", 1);
        if(fp == NULL) {
            rt = -1;
            break;
        }
        fclose(fp);
    }

    BCAST_AND_RAISEIF(rt, comm);

    return rt;
}